

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  GLFWbool GVar1;
  int iVar2;
  _GLFWwindow *ctxconfig_00;
  _GLFWmonitor *in_RCX;
  _GLFWwindow *in_RDX;
  uint in_ESI;
  uint in_EDI;
  undefined8 in_R8;
  int height_1;
  int width_1;
  _GLFWwindow *window;
  _GLFWwndconfig wndconfig;
  _GLFWctxconfig ctxconfig;
  _GLFWfbconfig fbconfig;
  _GLFWctxconfig *in_stack_fffffffffffffc08;
  _GLFWwindow *in_stack_fffffffffffffc10;
  uint uVar3;
  uint uVar4;
  _GLFWwindow *x;
  GLFWbool in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc34;
  GLFWbool local_3c8;
  int local_3c4;
  GLFWbool local_3c0;
  GLFWbool local_3bc;
  int local_3b4;
  GLFWbool local_3b0;
  _GLFWctxconfig *in_stack_fffffffffffffc70;
  _GLFWwindow *in_stack_fffffffffffffc78;
  int *in_stack_fffffffffffffc90;
  int *in_stack_fffffffffffffc98;
  _GLFWwindow *in_stack_fffffffffffffca0;
  int local_a8 [10];
  undefined8 local_80;
  int local_70;
  int local_6c;
  int local_68;
  undefined8 local_28;
  _GLFWmonitor *local_20;
  _GLFWwindow *local_18;
  uint local_10;
  uint local_c;
  _GLFWwindow *local_8;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_8 = (_GLFWwindow *)0x0;
  }
  else if (((int)in_EDI < 1) || ((int)in_ESI < 1)) {
    _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)in_EDI,(ulong)in_ESI);
    local_8 = (_GLFWwindow *)0x0;
  }
  else {
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_ESI;
    local_c = in_EDI;
    memcpy(&local_70,&_glfw.hints.framebuffer,0x48);
    memcpy(local_a8,&_glfw.hints.context,0x38);
    memcpy(&stack0xfffffffffffffc20,&_glfw.hints.window,0x338);
    local_80 = local_28;
    uVar3 = local_c;
    uVar4 = local_10;
    GVar1 = _glfwIsValidContextConfig(in_stack_fffffffffffffc08);
    if (GVar1 == 0) {
      local_8 = (_GLFWwindow *)0x0;
    }
    else {
      ctxconfig_00 = (_GLFWwindow *)calloc(1,0x388);
      ctxconfig_00->next = _glfw.windowListHead;
      _glfw.windowListHead = ctxconfig_00;
      (ctxconfig_00->videoMode).width = local_c;
      (ctxconfig_00->videoMode).height = local_10;
      (ctxconfig_00->videoMode).redBits = local_70;
      (ctxconfig_00->videoMode).greenBits = local_6c;
      (ctxconfig_00->videoMode).blueBits = local_68;
      (ctxconfig_00->videoMode).refreshRate = _glfw.hints.refreshRate;
      ctxconfig_00->monitor = local_20;
      ctxconfig_00->resizable = in_stack_fffffffffffffc30;
      ctxconfig_00->decorated = local_3c8;
      ctxconfig_00->autoIconify = local_3c0;
      ctxconfig_00->floating = local_3bc;
      ctxconfig_00->focusOnShow = local_3b0;
      ctxconfig_00->cursorMode = 0x34001;
      ctxconfig_00->minwidth = -1;
      ctxconfig_00->minheight = -1;
      ctxconfig_00->maxwidth = -1;
      ctxconfig_00->maxheight = -1;
      ctxconfig_00->numer = -1;
      ctxconfig_00->denom = -1;
      iVar2 = _glfwPlatformCreateWindow
                        (local_18,(_GLFWwndconfig *)CONCAT44(uVar4,uVar3),
                         (_GLFWctxconfig *)ctxconfig_00,(_GLFWfbconfig *)in_stack_fffffffffffffc10);
      if (iVar2 == 0) {
        glfwDestroyWindow((GLFWwindow *)CONCAT44(uVar4,uVar3));
        local_8 = (_GLFWwindow *)0x0;
      }
      else {
        x = local_18;
        if ((local_a8[0] == 0) ||
           (GVar1 = _glfwRefreshContextAttribs(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70),
           x = local_18, GVar1 != 0)) {
          local_8 = ctxconfig_00;
          if (ctxconfig_00->monitor == (_GLFWmonitor *)0x0) {
            if ((in_stack_fffffffffffffc34 != 0) &&
               (_glfwPlatformShowWindow((_GLFWwindow *)0x1716cc), local_8 = ctxconfig_00,
               local_3c4 != 0)) {
              _glfwPlatformFocusWindow(in_stack_fffffffffffffc10);
              local_8 = ctxconfig_00;
            }
          }
          else if (local_3b4 != 0) {
            _glfwPlatformGetWindowSize
                      (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90
                      );
            _glfwPlatformSetCursorPos
                      ((_GLFWwindow *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                       (double)x,(double)CONCAT44(uVar4,uVar3));
            local_8 = ctxconfig_00;
          }
        }
        else {
          glfwDestroyWindow((GLFWwindow *)CONCAT44(uVar4,uVar3));
          local_8 = (_GLFWwindow *)0x0;
        }
      }
    }
  }
  return (GLFWwindow *)local_8;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;

    assert(title != NULL);
    assert(width >= 0);
    assert(height >= 0);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);

        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor     = (_GLFWmonitor*) monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->focusOnShow = wndconfig.focusOnShow;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    window->minwidth    = GLFW_DONT_CARE;
    window->minheight   = GLFW_DONT_CARE;
    window->maxwidth    = GLFW_DONT_CARE;
    window->maxheight   = GLFW_DONT_CARE;
    window->numer       = GLFW_DONT_CARE;
    window->denom       = GLFW_DONT_CARE;

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        return NULL;
    }

    if (ctxconfig.client != GLFW_NO_API)
    {
        if (!_glfwRefreshContextAttribs(window, &ctxconfig))
        {
            glfwDestroyWindow((GLFWwindow*) window);
            return NULL;
        }
    }

    if (window->monitor)
    {
        if (wndconfig.centerCursor)
        {
            int width, height;
            _glfwPlatformGetWindowSize(window, &width, &height);
            _glfwPlatformSetCursorPos(window, width / 2.0, height / 2.0);
        }
    }
    else
    {
        if (wndconfig.visible)
        {
            _glfwPlatformShowWindow(window);
            if (wndconfig.focused)
                _glfwPlatformFocusWindow(window);
        }
    }

    return (GLFWwindow*) window;
}